

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int OptInit(char **a,s_options *o,FILE *err)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  s_options *psVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  char **ppcVar11;
  int n;
  long lVar12;
  double dVar13;
  char *local_50;
  FILE *local_48;
  double local_40;
  char **local_38;
  
  argv = a;
  op = o;
  errstream = err;
  if ((((a != (char **)0x0) && (o != (s_options *)0x0)) && (*a != (char *)0x0)) &&
     (pcVar8 = a[1], pcVar8 != (char *)0x0)) {
    lVar12 = 1;
    iVar10 = 0;
    local_48 = (FILE *)err;
    local_38 = a;
    do {
      ppcVar11 = argv;
      n = (int)lVar12;
      if ((*pcVar8 == '-') || (*pcVar8 == '+')) {
        pcVar8 = op->label;
        if (pcVar8 != (char *)0x0) {
          pcVar7 = argv[lVar12];
          psVar6 = op;
          do {
            sVar4 = strlen(pcVar8);
            iVar3 = strncmp(pcVar7 + 1,pcVar8,(long)(int)sVar4);
            if (iVar3 == 0) {
              if (psVar6->label != (char *)0x0) {
                pcVar2 = (code *)psVar6->arg;
                iVar3 = 0;
                if (pcVar2 == (code *)0x0) goto LAB_00106110;
                oVar1 = psVar6->type;
                if (oVar1 == OPT_FSTR) {
                  (*pcVar2)(pcVar7 + 2);
                  goto LAB_00106110;
                }
                if (oVar1 == OPT_FFLAG) {
                  (*pcVar2)();
                  goto LAB_00106110;
                }
                if (oVar1 == OPT_FLAG) {
                  *(uint *)pcVar2 = (uint)(*pcVar7 == '-');
                  goto LAB_00106110;
                }
                if ((FILE *)err == (FILE *)0x0) goto LAB_0010610b;
                pcVar8 = "%smissing argument on switch.\n";
                goto LAB_00105f30;
              }
              break;
            }
            pcVar8 = psVar6[1].label;
            psVar6 = psVar6 + 1;
          } while (pcVar8 != (char *)0x0);
        }
        if ((FILE *)err == (FILE *)0x0) {
LAB_0010610b:
          iVar3 = 1;
        }
        else {
          pcVar8 = "%sundefined option.\n";
LAB_00105f30:
          fprintf((FILE *)err,pcVar8,emsg);
          iVar3 = 1;
          errline(n,1,err);
        }
LAB_00106110:
        iVar10 = iVar10 + iVar3;
      }
      else {
        pcVar8 = strchr(pcVar8,0x3d);
        if (pcVar8 != (char *)0x0) {
          pcVar8 = strchr(ppcVar11[lVar12],0x3d);
          if (pcVar8 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                          ,0x77f,"int handleswitch(int, FILE *)");
          }
          *pcVar8 = '\0';
          psVar6 = op;
          pcVar7 = op->label;
          if (pcVar7 == (char *)0x0) {
            lVar9 = 0;
          }
          else {
            __s1 = ppcVar11[lVar12];
            ppcVar11 = &op[1].label;
            lVar9 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar7);
              if (iVar3 == 0) break;
              lVar9 = lVar9 + 1;
              pcVar7 = *ppcVar11;
              ppcVar11 = ppcVar11 + 4;
            } while (pcVar7 != (char *)0x0);
          }
          err = (FILE *)local_48;
          *pcVar8 = '=';
          if (psVar6[lVar9].label == (char *)0x0) {
            iVar3 = 1;
            if (local_48 != (FILE *)0x0) {
              fprintf(local_48,"%sundefined option.\n",emsg);
              errline(n,0,err);
            }
          }
          else {
            oVar1 = psVar6[lVar9].type;
            dVar13 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar8 = pcVar8 + 1;
              switch(oVar1) {
              default:
                if (local_48 != (FILE *)0x0) {
                  fprintf(local_48,"%soption requires an argument.\n",emsg);
                  errline(n,0,err);
                  dVar13 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar5 = strtol(pcVar8,&local_50,0);
                pcVar8 = local_50;
                if ((*local_50 != '\0') && (iVar3 = 1, (FILE *)err != (FILE *)0x0)) {
                  fprintf((FILE *)err,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar8 - *(int *)(argv + lVar12),err);
                }
                pcVar8 = (char *)0x0;
                dVar13 = 0.0;
                goto LAB_00106125;
              case OPT_DBL:
              case OPT_FDBL:
                dVar13 = strtod(pcVar8,&local_50);
                pcVar8 = local_50;
                if (*local_50 == '\0') goto LAB_00106120;
                if ((FILE *)err != (FILE *)0x0) {
                  local_40 = dVar13;
                  fprintf((FILE *)err,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar8 - *(int *)(argv + lVar12),err);
                  dVar13 = local_40;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105f98_caseD_4;
              }
              uVar5 = 0;
              iVar3 = 1;
              pcVar8 = (char *)0x0;
            }
            else {
LAB_00106120:
              pcVar8 = (char *)0x0;
switchD_00105f98_caseD_4:
              uVar5 = 0;
              iVar3 = 0;
            }
LAB_00106125:
            switch(op[lVar9].type) {
            case OPT_INT:
              *(int *)op[lVar9].arg = (int)uVar5;
              break;
            case OPT_DBL:
              *(double *)op[lVar9].arg = dVar13;
              break;
            case OPT_STR:
              *(char **)op[lVar9].arg = pcVar8;
              break;
            case OPT_FINT:
              (*(code *)op[lVar9].arg)(uVar5 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar9].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar9].arg)(pcVar8);
            }
          }
          iVar10 = iVar3 + iVar10;
        }
      }
      pcVar8 = argv[lVar12 + 1];
      lVar12 = lVar12 + 1;
    } while (pcVar8 != (char *)0x0);
    if (0 < iVar10) {
      fprintf((FILE *)err,"Valid command line options for \"%s\" are:\n",*local_38);
      OptPrint();
      exit(1);
    }
  }
  return 0;
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  argv = a;
  op = o;
  errstream = err;
  if( argv && *argv && op ){
    int i;
    for(i=1; argv[i]; i++){
      if( argv[i][0]=='+' || argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}